

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::f_ftilda(Forth *this)

{
  ForthStack<double> *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint x;
  double dVar7;
  double dVar8;
  double dVar9;
  
  requireDStackAvailable(this,3,"F~");
  requireFStackDepth(this,3,"F~");
  this_00 = &this->fStack;
  dVar7 = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  dVar8 = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  dVar9 = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  x = this->False;
  if (dVar7 <= 0.0) {
    if (((dVar7 != 0.0) || (NAN(dVar7))) || (dVar9 != dVar8)) goto LAB_00118497;
  }
  else if (dVar7 <= ABS(dVar8 - dVar9)) goto LAB_00118497;
  x = this->True;
LAB_00118497:
  if (dVar7 < 0.0) {
    iVar3 = (int)dVar9;
    uVar5 = (uint)(dVar9 - dVar8);
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    iVar6 = (int)dVar7;
    iVar2 = -iVar6;
    if (0 < iVar6) {
      iVar2 = iVar6;
    }
    iVar6 = -iVar3;
    if (0 < iVar3) {
      iVar6 = iVar3;
    }
    iVar4 = (int)dVar8;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    if (uVar1 < (uint)((iVar3 + iVar6) * iVar2)) {
      x = this->True;
    }
  }
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void f_ftilda(){
			REQUIRE_DSTACK_AVAILABLE(3, "F~");
			REQUIRE_FSTACK_DEPTH(3, "F~");
			auto r3 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0); fStack.pop();
			auto r1 = fStack.getTop(0); fStack.pop();
			Cell ret = False;
			if (r3 > 0.0){
				if (fabs(r2 - r1) < r3) ret = True;
			}
			else if ((r3 == 0.0) || (r3 == -0.0)){
				if (memcmp(&r1, &r2,sizeof(r1))==0) 
					ret = True;
			} if (r3 < 0.0){
				if (abs(r1 - r2) < (abs(r3)*(abs(r1) + abs(r2)))) ret = True;
			}
			dStack.push(ret);
		}